

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  socklen_t sinLength;
  sockaddr_in6 sin;
  socklen_t local_28;
  sockaddr local_24;
  undefined8 uStack_14;
  enet_uint16 local_c;
  
  local_28 = 0x1c;
  iVar1 = getsockname(socket,&local_24,&local_28);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *(undefined8 *)&(address->host).__in6_u = local_24.sa_data._6_8_;
    *(undefined8 *)((long)&(address->host).__in6_u + 8) = uStack_14;
    address->port = local_24.sa_data._0_2_ << 8 | (ushort)local_24.sa_data._0_2_ >> 8;
    address->sin6_scope_id = local_c;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int enet_socket_get_address(ENetSocket socket, ENetAddress *address) {
        struct sockaddr_in6 sin;
        socklen_t sinLength = sizeof(struct sockaddr_in6);

        if (getsockname(socket, (struct sockaddr *) &sin, &sinLength) == -1) {
            return -1;
        }

        address->host           = sin.sin6_addr;
        address->port           = ENET_NET_TO_HOST_16(sin.sin6_port);
        address->sin6_scope_id  = sin.sin6_scope_id;

        return 0;
    }